

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::debugging_internal::ElfMemImage::LookupSymbol
          (ElfMemImage *this,char *name,char *version,int type,SymbolInfo *info_out)

{
  int iVar1;
  SymbolIterator __begin2;
  SymbolIterator __end2;
  SymbolIterator local_90;
  SymbolIterator local_60;
  
  SymbolIterator::SymbolIterator(&local_90,this,0);
  SymbolIterator::Update(&local_90,0);
  SymbolIterator::SymbolIterator(&local_60,this,this->num_syms_);
  if ((local_90.image_ != local_60.image_) || (local_90.index_ != local_60.index_)) {
    do {
      iVar1 = strcmp(local_90.info_.name,name);
      if (((iVar1 == 0) && (iVar1 = strcmp(local_90.info_.version,version), iVar1 == 0)) &&
         (((local_90.info_.symbol)->st_info & 0xf) == type)) {
        if (info_out != (SymbolInfo *)0x0) {
          info_out->address = local_90.info_.address;
          info_out->symbol = local_90.info_.symbol;
          info_out->name = local_90.info_.name;
          info_out->version = local_90.info_.version;
          return true;
        }
        return true;
      }
      SymbolIterator::Update(&local_90,1);
    } while ((local_90.image_ != local_60.image_) || (local_90.index_ != local_60.index_));
  }
  return false;
}

Assistant:

bool ElfMemImage::LookupSymbol(const char *name,
                               const char *version,
                               int type,
                               SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    if (strcmp(info.name, name) == 0 && strcmp(info.version, version) == 0 &&
        ElfType(info.symbol) == type) {
      if (info_out) {
        *info_out = info;
      }
      return true;
    }
  }
  return false;
}